

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genData.hpp
# Opt level: O2

pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *
genPlanePair<double>
          (pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
           *__return_storage_ptr__,Matrix<double,_4,_4,_0,_4,_4> *T)

{
  RandomReturnType local_16b;
  Matrix<double,_4,_1,_0,_4,_1> Pi;
  Matrix<double,_4,_1,_0,_4,_1> Nu;
  Matrix<double,_4,_4,_0,_4,_4> *local_108;
  DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *local_100;
  FullPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> lu;
  Matrix<double,_3,_4,_0,_3,_4> nullMatrix;
  
  lu.m_isInitialized = false;
  lu.m_usePrescribedThreshold = false;
  lu.m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  lu.m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  lu.m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  lu.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (int *)0x0;
  lu.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  lu.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (int *)0x0;
  lu.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  lu.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (int *)0x0;
  lu.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  lu.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,__1,_1,_1,__1>_>.m_storage.
  m_data = (int *)0x0;
  lu.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,__1,_1,_1,__1>_>.m_storage.
  m_cols = 0;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::Ones((ConstantReturnType *)&Nu,3,4);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,4,0,3,4>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,4,0,3,4>>>
            (&nullMatrix,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_4,_0,_3,_4>_>
              *)&Nu);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Random(&local_16b,3,3);
  local_108 = (Matrix<double,_4,_4,_0,_4,_4> *)CONCAT44(local_108._4_4_,0x28);
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               *)&Pi,(MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
                      *)&local_16b,(int *)&local_108);
  Eigen::DenseBase<Eigen::Matrix<double,3,4,0,3,4>>::topLeftCorner<int,int>
            ((Type *)&Nu,&nullMatrix,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
            ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,__1,__1,_false> *)&Nu,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)&Pi);
  Eigen::FullPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>::compute<Eigen::Matrix<double,3,4,0,3,4>>
            ((FullPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&lu,
             (EigenBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)&nullMatrix);
  Eigen::FullPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::kernel
            ((kernel_retval<Eigen::FullPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&Nu,&lu)
  ;
  Eigen::PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>>::
  PlainObjectBase<Eigen::internal::kernel_retval_base<Eigen::FullPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>>>
            ((PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>> *)&Pi,
             (ReturnByValue<Eigen::internal::kernel_retval_base<Eigen::FullPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&Nu);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::head<int>
            ((Type *)&Nu,(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&Pi,3);
  local_108 = (Matrix<double,_4,_4,_0,_4,_4> *)
              Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_-1,_1,_false>_>::
              norm((MatrixBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_> *)
                   &Nu);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator/=
            ((DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&Pi,(Scalar *)&local_108);
  local_108 = T;
  local_100 = (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&Pi;
  Eigen::PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,4,4,0,4,4>>>,Eigen::Matrix<double,4,1,0,4,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,4,1,0,4,1>> *)&Nu,
             (DenseBase<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>_>
              *)&local_108);
  (__return_storage_ptr__->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[2] =
       Pi.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2];
  (__return_storage_ptr__->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[3] =
       Pi.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3];
  (__return_storage_ptr__->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[0] =
       Pi.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0];
  (__return_storage_ptr__->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[1] =
       Pi.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1];
  (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[0] =
       Nu.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0];
  (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[1] =
       Nu.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1];
  (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[2] =
       Nu.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2];
  (__return_storage_ptr__->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[3] =
       Nu.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3];
  Eigen::FullPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~FullPivLU(&lu);
  return __return_storage_ptr__;
}

Assistant:

std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>> 
    genPlanePair(Eigen::Matrix<floatPrec,4,4> T){
    
    Eigen::Matrix<floatPrec, 3, 4> nullMatrix;
    Eigen::FullPivLU<Eigen::Matrix<floatPrec, Eigen::Dynamic, Eigen::Dynamic>> lu;

    // the null space of the matrix built from threee
    // randomly generated 3D points in homogenous coordinates
    nullMatrix = Eigen::Matrix<floatPrec, 3, 4>::Ones(3, 4);
    
    nullMatrix.topLeftCorner(3, 3) =
        Eigen::Matrix<floatPrec, 3, 3>::Random(3, 3) * int(POINTSWITHINCUBE);

    lu.compute(nullMatrix);
    Eigen::Matrix<floatPrec, 4,1> Pi = lu.kernel();
    Pi /= Pi.head(3).norm();

    // requires the pose from the two scans, to compute
    // the coordinates of the plane in RefB
    Eigen::Matrix<floatPrec, 4,1> Nu = T.transpose().inverse() * Pi;

    return std::make_pair(Pi,Nu);
}